

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiListClipper::Begin(ImGuiListClipper *this,int count,float items_height)

{
  float in_ESI;
  float *in_RDI;
  float in_XMM0_Da;
  int *unaff_retaddr;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  *in_RDI = (GImGui->CurrentWindow->DC).CursorPos.y;
  in_RDI[1] = in_XMM0_Da;
  in_RDI[2] = in_ESI;
  in_RDI[3] = 0.0;
  in_RDI[4] = -NAN;
  in_RDI[5] = -NAN;
  if (0.0 < in_RDI[1]) {
    ImGui::CalcListClipping(g._4_4_,g._0_4_,(int *)window,unaff_retaddr);
    if (0 < (int)in_RDI[4]) {
      SetCursorPosYAndSetupDummyPrevLine(in_ESI,in_XMM0_Da);
    }
    in_RDI[3] = 2.8026e-45;
  }
  return;
}

Assistant:

void ImGuiListClipper::Begin(int count, float items_height)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    StartPosY = window->DC.CursorPos.y;
    ItemsHeight = items_height;
    ItemsCount = count;
    StepNo = 0;
    DisplayEnd = DisplayStart = -1;
    if (ItemsHeight > 0.0f)
    {
        ImGui::CalcListClipping(ItemsCount, ItemsHeight, &DisplayStart, &DisplayEnd); // calculate how many to clip/display
        if (DisplayStart > 0)
            SetCursorPosYAndSetupDummyPrevLine(StartPosY + DisplayStart * ItemsHeight, ItemsHeight); // advance cursor
        StepNo = 2;
    }
}